

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O3

void __thiscall
blockfilter_tests::gcsfilter_default_constructor::test_method(gcsfilter_default_constructor *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 local_168 [24];
  char *local_150;
  char *local_148;
  undefined1 local_13c [12];
  undefined1 local_130;
  undefined1 *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  GCSFilter filter;
  GCSFilter *local_b8;
  undefined **local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  GCSFilter **local_98;
  GCSFilter *local_90;
  undefined1 local_88 [20];
  uint32_t uStack_74;
  GCSFilter **local_70;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._16_4_ = local_88._16_4_ & 0xffffff00;
  uStack_74 = 1;
  GCSFilter::GCSFilter(&filter,(Params *)local_88);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2f;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_130 = 0;
  local_13c._4_8_ = &PTR__lazy_ostream_013ae088;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_90 = (GCSFilter *)local_168;
  local_168._0_4_ = filter.m_N;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(filter.m_N == 0);
  local_13c._0_4_ = 0;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_58 = "";
  local_70 = &local_90;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ae108;
  stack0xffffffffffffff88 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013ae108;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b8 = (GCSFilter *)local_13c;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)(local_13c + 4),1,2,REQUIRE,0xe6ae45,(size_t)&local_60,0x2f,
             (Params *)local_88,"0U",&local_b0);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_148 = "";
  local_168._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_168._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x30;
  file_00.m_begin = (iterator)&local_150;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)(local_168 + 8),
             msg_00);
  local_130 = 0;
  local_13c._4_8_ = &PTR__lazy_ostream_013ae088;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_168._0_8_ =
       (long)filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_120 = "";
  local_13c._0_4_ = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_168._0_8_ == 1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_58 = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ae0c8;
  stack0xffffffffffffff88 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_90;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013ae108;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b8 = (GCSFilter *)local_13c;
  local_90 = (GCSFilter *)local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)(local_13c + 4),1,2,REQUIRE,0xe6ae53,(size_t)&local_60,0x30,
             (Params *)local_88,"1U",&local_b0);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x33;
  file_01.m_begin = (iterator)&local_178;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_188,
             msg_01);
  local_130 = 0;
  local_13c._4_8_ = &PTR__lazy_ostream_013ae088;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(filter.m_params.m_siphash_k0 == 0);
  local_168._0_8_ = local_168._0_8_ & 0xffffffff00000000;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_58 = "";
  local_90 = &filter;
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ae0c8;
  stack0xffffffffffffff88 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_90;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013ae108;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b8 = (GCSFilter *)local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)(local_13c + 4),1,2,REQUIRE,0xe6ae6e,(size_t)&local_60,0x33,
             (Params *)local_88,"0U",&local_b0);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x34;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  local_130 = 0;
  local_13c._4_8_ = &PTR__lazy_ostream_013ae088;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_90 = (GCSFilter *)&filter.m_params.m_siphash_k1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(filter.m_params.m_siphash_k1 == 0);
  local_168._0_8_ = local_168._0_8_ & 0xffffffff00000000;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_58 = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ae0c8;
  stack0xffffffffffffff88 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_90;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013ae108;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b8 = (GCSFilter *)local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)(local_13c + 4),1,2,REQUIRE,0xe6ae82,(size_t)&local_60,0x34,
             (Params *)local_88,"0U",&local_b0);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x35;
  file_03.m_begin = (iterator)&local_1b8;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1c8,
             msg_03);
  local_130 = 0;
  local_13c._4_8_ = &PTR__lazy_ostream_013ae088;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_90 = (GCSFilter *)&filter.m_params.m_P;
  local_168._0_8_ = local_168._0_8_ & 0xffffffff00000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(filter.m_params.m_P == '\0');
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_58 = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013aee50;
  stack0xffffffffffffff88 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_90;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013ae248;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b8 = (GCSFilter *)local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)(local_13c + 4),1,2,REQUIRE,0xe6ae96,(size_t)&local_60,0x35,
             (Params *)local_88,"0",&local_b0);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x36;
  file_04.m_begin = (iterator)&local_1d8;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e8,
             msg_04);
  local_130 = 0;
  local_13c._4_8_ = &PTR__lazy_ostream_013ae088;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_90 = (GCSFilter *)&filter.m_params.m_M;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(filter.m_params.m_M == 1);
  local_168._0_4_ = 1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_58 = "";
  local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
  local_88._0_8_ = &PTR__lazy_ostream_013ae108;
  stack0xffffffffffffff88 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_90;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013ae108;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  local_b8 = (GCSFilter *)local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)(local_13c + 4),1,2,REQUIRE,0xe6aea1,(size_t)&local_60,0x36,
             (Params *)local_88,"1U",&local_b0);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(gcsfilter_default_constructor)
{
    GCSFilter filter;
    BOOST_CHECK_EQUAL(filter.GetN(), 0U);
    BOOST_CHECK_EQUAL(filter.GetEncoded().size(), 1U);

    const GCSFilter::Params& params = filter.GetParams();
    BOOST_CHECK_EQUAL(params.m_siphash_k0, 0U);
    BOOST_CHECK_EQUAL(params.m_siphash_k1, 0U);
    BOOST_CHECK_EQUAL(params.m_P, 0);
    BOOST_CHECK_EQUAL(params.m_M, 1U);
}